

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

void ZSTD_reduceTable_btlazy2(U32 *table,U32 size,U32 reducerValue)

{
  U32 local_44;
  U32 reducerValue_local;
  U32 size_local;
  U32 *table_local;
  U32 adder;
  int column;
  int rowNb;
  int cellNb;
  int nbRows;
  
  column = 0;
  for (adder = 0; (int)adder < (int)size / 0x10; adder = adder + 1) {
    for (table_local._4_4_ = 0; table_local._4_4_ < 0x10; table_local._4_4_ = table_local._4_4_ + 1)
    {
      local_44 = reducerValue;
      if (table[column] != 1) {
        local_44 = 0;
      }
      table[column] = local_44 + table[column];
      if (table[column] < reducerValue) {
        table[column] = 0;
      }
      else {
        table[column] = table[column] - reducerValue;
      }
      column = column + 1;
    }
  }
  return;
}

Assistant:

static void ZSTD_reduceTable_btlazy2(U32* const table, U32 const size, U32 const reducerValue)
{
    ZSTD_reduceTable_internal(table, size, reducerValue, 1);
}